

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOService.cpp
# Opt level: O3

void anon_unknown.dwarf_62f9fb::handle_io<curious_read_record>
               (curious_callback_type_t type,void *usr_data,curious_read_record *record)

{
  bool bVar1;
  SnapshotView trigger_info;
  Caliper c;
  Variant filesystem_var;
  Variant mount_point_var;
  Caliper CStack_68;
  cali_variant_t local_48;
  anon_union_8_7_33918203_for_value local_38;
  cali_variant_t local_30;
  
  (anonymous_namespace)::num_io_callbacks = (anonymous_namespace)::num_io_callbacks + 1;
  cali::Caliper::sigsafe_instance();
  bVar1 = cali::Caliper::operator_cast_to_bool(&CStack_68);
  if (bVar1) {
    bVar1 = cali::Channel::is_active((Channel *)((long)usr_data + 8));
    if (bVar1) {
      if ((type & 1U) == 0) {
        local_48 = (cali_variant_t)make_variant(record->filesystem);
        local_30 = (cali_variant_t)make_variant(record->mount_point);
        cali::Caliper::begin
                  (&CStack_68,(Attribute *)&(anonymous_namespace)::io_mount_point_attr,
                   (Variant *)&local_30);
        cali::Caliper::begin
                  (&CStack_68,(Attribute *)&(anonymous_namespace)::io_filesystem_attr,
                   (Variant *)&local_48);
        cali::Caliper::begin
                  (&CStack_68,(Attribute *)&(anonymous_namespace)::io_region_attr,
                   (Variant *)((anonymous_namespace)::categories + (long)(type >> 1) * 0x10));
        return;
      }
      if (record->bytes_read != 0) {
        local_48.value.v_uint = 3;
        local_48.type_and_size = _ZN12_GLOBAL__N_118io_bytes_read_attrE_0;
        trigger_info.m_len = 1;
        trigger_info.m_data = (Entry *)&local_48;
        local_38 = (anon_union_8_7_33918203_for_value)record->bytes_read;
        cali::Caliper::push_snapshot
                  (&CStack_68,
                   (((Channel *)((long)usr_data + 8))->mP).
                   super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   trigger_info);
      }
      cali::Caliper::end(&CStack_68,(Attribute *)&(anonymous_namespace)::io_region_attr);
      cali::Caliper::end(&CStack_68,(Attribute *)&(anonymous_namespace)::io_filesystem_attr);
      cali::Caliper::end(&CStack_68,(Attribute *)&(anonymous_namespace)::io_mount_point_attr);
      return;
    }
  }
  (anonymous_namespace)::num_failed_io_callbacks =
       (anonymous_namespace)::num_failed_io_callbacks + 1;
  return;
}

Assistant:

void handle_io(curious_callback_type_t type, void* usr_data, Record* record)
{
    ++num_io_callbacks;

    // get a Caliper instance

    Caliper c    = Caliper::sigsafe_instance();
    auto    data = static_cast<user_data_t*>(usr_data);

    // If we got a Caliper instance successfully...
    if (c && data->channel.is_active()) {
        // ...mark the end...
        if (type & CURIOUS_POST_CALLBACK) {
            handle_unique_record_data(c, data->channel, record);

            c.end(io_region_attr);
            c.end(io_filesystem_attr);
            c.end(io_mount_point_attr);

            // ...or begining of the I/O region, as appropriate
        } else {
            Variant filesystem_var  = make_variant(record->filesystem);
            Variant mount_point_var = make_variant(record->mount_point);

            c.begin(io_mount_point_attr, mount_point_var);
            c.begin(io_filesystem_attr, filesystem_var);
            c.begin(io_region_attr, categories[GET_CATEGORY(type)]);
        }

        // ...otherwise not our failure (probably already inside Caliper)
    } else {
        ++num_failed_io_callbacks;
    }
}